

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O2

void av1_compute_gm_for_valid_ref_frames
               (AV1_COMP *cpi,aom_internal_error_info *error_info,YV12_BUFFER_CONFIG **ref_buf,
               int frame,MotionModel *motion_models,uint8_t *segment_map,int segment_map_w,
               int segment_map_h)

{
  RefCntBuffer *pRVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  uint16_t n;
  uint8_t *segment_map_00;
  WarpedMotionParams *pWVar3;
  _Bool _Var4;
  bool bVar5;
  TransformationType type;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int64_t ref_frame_error;
  int64_t iVar10;
  sbyte sVar11;
  long lVar12;
  ulong uVar13;
  _Bool mem_alloc_failed;
  long local_e0;
  int local_d4;
  double local_d0;
  ulong local_c8;
  YV12_BUFFER_CONFIG **local_c0;
  AV1_COMP *local_b8;
  MotionModel *local_b0;
  int local_a4;
  aom_bit_depth_t local_a0;
  WarpedMotionParams local_9c;
  double local_78;
  double local_70;
  ulong local_68;
  uint8_t *local_60;
  aom_internal_error_info *local_58;
  WarpedMotionParams *local_50;
  WarpedMotionParams *local_48;
  ulong local_40;
  ulong local_38;
  
  pRVar1 = (cpi->common).prev_frame;
  lVar12 = (long)frame;
  local_48 = &default_warp_params;
  if (pRVar1 != (RefCntBuffer *)0x0) {
    local_48 = pRVar1->global_motion + lVar12;
  }
  pYVar2 = cpi->source;
  local_38 = (ulong)(uint)(pYVar2->field_2).field_0.y_crop_width;
  local_68 = (ulong)(uint)(pYVar2->field_3).field_0.y_crop_height;
  uVar13 = (ulong)(uint)(pYVar2->field_4).field_0.y_stride;
  local_a0 = ((cpi->common).seq_params)->bit_depth;
  local_a4 = (cpi->sf).gm_sf.downsample_level;
  local_78 = erroradv_tr[(cpi->sf).gm_sf.gm_erroradv_tr_level];
  local_40 = (ulong)(uint)(cpi->sf).gm_sf.num_refinement_steps;
  mem_alloc_failed = false;
  local_50 = (cpi->common).global_motion + lVar12;
  local_e0 = lVar12;
  local_c8 = uVar13;
  local_c0 = ref_buf;
  local_b8 = cpi;
  local_b0 = motion_models;
  local_70 = local_78;
  local_60 = segment_map;
  local_58 = error_info;
  for (type = '\x02'; type != '\x03'; type = type + '\x01') {
    _Var4 = aom_compute_global_motion
                      (type,cpi->source,ref_buf[lVar12],local_a0,GLOBAL_MOTION_METHOD_DISFLOW,
                       local_a4,motion_models,1,&mem_alloc_failed);
    if (_Var4) {
      bVar5 = true;
      while ((bVar5 && (motion_models->num_inliers != 0))) {
        av1_convert_model_to_params(motion_models->params,&local_9c);
        iVar6 = av1_get_shear_params(&local_9c);
        segment_map_00 = local_60;
        lVar12 = local_e0;
        if ((iVar6 != 0) && (1 < local_9c.wmtype)) {
          av1_compute_feature_segmentation_map
                    (local_60,segment_map_w,segment_map_h,motion_models->inliers,
                     motion_models->num_inliers);
          iVar6 = (int)local_38;
          ref_frame_error =
               av1_segmented_frame_error
                         ((uint)((cpi->td).mb.e_mbd.cur_buf)->flags >> 3 & 1,(cpi->td).mb.e_mbd.bd,
                          (ref_buf[lVar12]->field_5).field_0.y_buffer,
                          (ref_buf[lVar12]->field_4).field_0.y_stride,
                          (cpi->source->field_5).field_0.y_buffer,(int)uVar13,iVar6,(int)local_68,
                          segment_map_00,segment_map_w);
          motion_models = local_b0;
          if (ref_frame_error != 0) {
            pYVar2 = ref_buf[lVar12];
            iVar10 = av1_refine_integerized_param
                               (&local_9c,local_9c.wmtype,
                                (uint)((cpi->td).mb.e_mbd.cur_buf)->flags >> 3 & 1,
                                (cpi->td).mb.e_mbd.bd,(pYVar2->field_5).field_0.y_buffer,
                                (pYVar2->field_2).field_0.y_crop_width,
                                (pYVar2->field_3).field_0.y_crop_height,
                                (pYVar2->field_4).field_0.y_stride,
                                (cpi->source->field_5).field_0.y_buffer,iVar6,(int)local_68,
                                (int)uVar13,(int)local_40,ref_frame_error,local_60,segment_map_w,
                                local_70);
            pWVar3 = local_48;
            motion_models = local_b0;
            cpi = local_b8;
            lVar12 = local_e0;
            ref_buf = local_c0;
            uVar13 = local_c8;
            if (1 < local_9c.wmtype) {
              iVar6 = 0;
              local_d0 = (double)ref_frame_error;
              if ((local_9c.wmtype & 0xfe) == 2) {
                _Var4 = (local_b8->common).features.allow_high_precision_mv;
                iVar7 = aom_count_signed_primitive_refsubexpfin
                                  (0x1001,3,(ushort)((uint)local_48->wmmat[2] >> 1) ^ 0x8000,
                                   (ushort)((uint)local_9c.wmmat[2] >> 1) ^ 0x8000);
                iVar8 = aom_count_signed_primitive_refsubexpfin
                                  (0x1001,3,(int16_t)((uint)pWVar3->wmmat[3] >> 1),
                                   (int16_t)((uint)local_9c.wmmat[3] >> 1));
                iVar6 = iVar8 + iVar7;
                if (2 < local_9c.wmtype) {
                  iVar6 = aom_count_signed_primitive_refsubexpfin
                                    (0x1001,3,(int16_t)((uint)pWVar3->wmmat[4] >> 1),
                                     (int16_t)((uint)local_9c.wmmat[4] >> 1));
                  iVar9 = aom_count_signed_primitive_refsubexpfin
                                    (0x1001,3,(ushort)((uint)pWVar3->wmmat[5] >> 1) ^ 0x8000,
                                     (ushort)((uint)local_9c.wmmat[5] >> 1) ^ 0x8000);
                  iVar6 = iVar8 + iVar7 + iVar9 + iVar6;
                }
                local_d4 = iVar6;
                sVar11 = (_Var4 == false) + 0xd;
                n = (ushort)_Var4 * 0x100 + 0x101;
                if (local_9c.wmtype != 1) {
                  n = 0x1001;
                }
                if (local_9c.wmtype != 1) {
                  sVar11 = 10;
                }
                iVar6 = aom_count_signed_primitive_refsubexpfin
                                  (n,3,(int16_t)(pWVar3->wmmat[0] >> sVar11),
                                   (int16_t)(local_9c.wmmat[0] >> sVar11));
                iVar6 = iVar6 + local_d4;
                iVar7 = aom_count_signed_primitive_refsubexpfin
                                  (n,3,(int16_t)(pWVar3->wmmat[1] >> sVar11),
                                   (int16_t)(local_9c.wmmat[1] >> sVar11));
                iVar6 = (iVar7 + iVar6) * 0x200;
              }
              lVar12 = local_e0;
              local_d0 = (double)iVar10 / (double)(long)local_d0;
              iVar6 = av1_is_enough_erroradvantage(local_d0,iVar6,local_70);
              cpi = local_b8;
              ref_buf = local_c0;
              uVar13 = local_c8;
              if ((iVar6 != 0) && (local_d0 < local_78)) {
                local_50->wmtype = local_9c.wmtype;
                local_50->invalid = local_9c.invalid;
                *(undefined2 *)&local_50->field_0x22 = local_9c._34_2_;
                *(ulong *)(local_50->wmmat + 4) = CONCAT44(local_9c.wmmat[5],local_9c.wmmat[4]);
                local_50->alpha = local_9c.alpha;
                local_50->beta = local_9c.beta;
                local_50->gamma = local_9c.gamma;
                local_50->delta = local_9c.delta;
                *(ulong *)local_50->wmmat = CONCAT44(local_9c.wmmat[1],local_9c.wmmat[0]);
                *(ulong *)(local_50->wmmat + 2) = CONCAT44(local_9c.wmmat[3],local_9c.wmmat[2]);
                local_78 = local_d0;
              }
            }
          }
        }
        bVar5 = false;
      }
    }
    else if (mem_alloc_failed == true) {
      aom_internal_error(local_58,AOM_CODEC_MEM_ERROR,"Failed to allocate global motion buffers");
    }
  }
  return;
}

Assistant:

void av1_compute_gm_for_valid_ref_frames(
    AV1_COMP *cpi, struct aom_internal_error_info *error_info,
    YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES], int frame,
    MotionModel *motion_models, uint8_t *segment_map, int segment_map_w,
    int segment_map_h) {
  AV1_COMMON *const cm = &cpi->common;
  const WarpedMotionParams *ref_params =
      cm->prev_frame ? &cm->prev_frame->global_motion[frame]
                     : &default_warp_params;

  compute_global_motion_for_ref_frame(cpi, error_info, ref_buf, frame,
                                      motion_models, segment_map, segment_map_w,
                                      segment_map_h, ref_params);
}